

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O1

void __thiscall
bssl::(anonymous_namespace)::SSLVersionTest_SequenceNumber_Test::~SSLVersionTest_SequenceNumber_Test
          (SSLVersionTest_SequenceNumber_Test *this)

{
  *(undefined ***)(this + -0x10) = &PTR__SSLVersionTest_004385f0;
  *(undefined ***)this = &PTR__SSLVersionTest_00438630;
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)(this + 0x38));
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)(this + 0x30));
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)(this + 0x28));
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)(this + 0x20));
  std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)(this + 0x18));
  std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)(this + 0x10));
  testing::Test::~Test((Test *)(this + -0x10));
  operator_delete((Test *)(this + -0x10),0x50);
  return;
}

Assistant:

TEST_P(SSLVersionTest, SequenceNumber) {
  // TODO(crbug.com/42290608): Once |SSL_get_read_sequence| and
  // |SSL_get_write_sequence| are no longer implemented in DTLS 1.3, make this
  // test TLS-only and remove the DTLS cases. For now, since we still care about
  // their behavior in DTLS 1.2, continue testing this behavior.
  if (is_dtls() && is_tls13()) {
    return;
  }

  ASSERT_TRUE(Connect());

  // Drain any post-handshake messages to ensure there are no unread records
  // on either end.
  ASSERT_TRUE(FlushNewSessionTickets(client_.get(), server_.get()));

  uint64_t client_read_seq = SSL_get_read_sequence(client_.get());
  uint64_t client_write_seq = SSL_get_write_sequence(client_.get());
  uint64_t server_read_seq = SSL_get_read_sequence(server_.get());
  uint64_t server_write_seq = SSL_get_write_sequence(server_.get());

  if (is_dtls()) {
    // Both client and server must be at epoch 1.
    EXPECT_EQ(EpochFromSequence(client_read_seq), 1);
    EXPECT_EQ(EpochFromSequence(client_write_seq), 1);
    EXPECT_EQ(EpochFromSequence(server_read_seq), 1);
    EXPECT_EQ(EpochFromSequence(server_write_seq), 1);

    // The next record to be written should exceed the largest received.
    EXPECT_GT(client_write_seq, server_read_seq);
    EXPECT_GT(server_write_seq, client_read_seq);
  } else {
    // The next record to be written should equal the next to be received.
    EXPECT_EQ(client_write_seq, server_read_seq);
    EXPECT_EQ(server_write_seq, client_read_seq);
  }

  // Send a record from client to server.
  uint8_t byte = 0;
  EXPECT_EQ(SSL_write(client_.get(), &byte, 1), 1);
  EXPECT_EQ(SSL_read(server_.get(), &byte, 1), 1);

  // The client write and server read sequence numbers should have
  // incremented.
  EXPECT_EQ(client_write_seq + 1, SSL_get_write_sequence(client_.get()));
  EXPECT_EQ(server_read_seq + 1, SSL_get_read_sequence(server_.get()));
}